

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_reader.cpp
# Opt level: O2

void __thiscall diffusion::NetReader::~NetReader(NetReader *this)

{
  ~NetReader(this);
  operator_delete(this,0xb8);
  return;
}

Assistant:

NetReader::~NetReader() {
    receiver_->shut_down();
    receiver_thread_.join();
}